

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O2

int tokthfind(toktdef *tab1,int typ,uint val,toksdef *ret)

{
  int iVar1;
  uint hash;
  tokseadef ctx;
  
  ctx.tokseasym.tokstyp = (uchar)typ;
  ctx.tokseasym.toksval = (ushort)val;
  hash = 0;
  ctx.toksearet = ret;
  do {
    if (hash == 0x100) {
      return 0;
    }
    iVar1 = tokthscan((tokthdef *)tab1,hash,tokthfind1,&ctx);
    hash = hash + 1;
  } while (iVar1 == 0);
  return 1;
}

Assistant:

int tokthfind(toktdef *tab1, int typ, uint val, toksdef *ret)
{
    tokseadef ctx;
    int       i;
    
    ctx.tokseasym.tokstyp = typ;
    ctx.tokseasym.toksval = val;
    ctx.toksearet = ret;
    
    for (i = 0 ; i < TOKHASHSIZE ; ++i)
    {
        if (tokthscan((tokthdef *)tab1, i, tokthfind1, &ctx))
            return(TRUE);
    }
    return(FALSE);
}